

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O1

bool __thiscall
sptk::reaper::EpochTracker::GetLpcResidual
          (EpochTracker *this,vector<float,_std::allocator<float>_> *input,float sample_rate,
          vector<float,_std::allocator<float>_> *output)

{
  pointer pfVar1;
  pointer pfVar2;
  int iVar3;
  int iVar4;
  float *lpca;
  float *lpca_00;
  void *pvVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  int wsize;
  long lVar12;
  long lVar13;
  bool bVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  ulong local_b0;
  float preemp_rms;
  float norm_error;
  long local_98;
  long local_90;
  vector<float,_std::allocator<float>_> *local_88;
  long local_80;
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  LpcAnalyzer lp;
  
  uVar8 = (uint)((long)(input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 2);
  if (((int)uVar8 < 1) ||
     (output == (vector<float,_std::allocator<float>_> *)0x0 || sample_rate <= 0.0)) {
LAB_0010dd83:
    bVar14 = false;
  }
  else {
    std::vector<float,_std::allocator<float>_>::resize(output,(ulong)(uVar8 & 0x7fffffff));
    iVar7 = (int)(this->lpc_frame_interval_ * sample_rate + 0.5);
    wsize = (int)(this->frame_duration_ * sample_rate + 0.5);
    local_b0 = (long)(int)(uVar8 - wsize) / (long)iVar7;
    iVar3 = (int)local_b0;
    local_b0 = local_b0 & 0xffffffff;
    if ((int)uVar8 < iVar3 * iVar7 + wsize) {
      local_b0 = (ulong)(iVar3 + 1);
    }
    else if (iVar3 < 1) goto LAB_0010dd83;
    lp.window_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    lp.window_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    lp.energywind_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    lp.window_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    uVar8 = (uint)(sample_rate / 1000.0 + 2.5);
    uVar11 = (ulong)uVar8;
    lp.energywind_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    lp.energywind_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    uVar10 = uVar8 + 1;
    uVar9 = 0xffffffffffffffff;
    if (-2 < (int)uVar8) {
      uVar9 = (long)(int)uVar10 << 2;
    }
    lpca = (float *)operator_new__(uVar9);
    lpca_00 = (float *)operator_new__(uVar9);
    pvVar5 = operator_new__(uVar9);
    norm_error = 0.0;
    preemp_rms = 0.0;
    iVar3 = LpcAnalyzer::ComputeLpc
                      (&lp,uVar8,this->noise_floor_,wsize,
                       (input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start,lpca_00,(float *)0x0,(float *)0x0,
                       &norm_error,&preemp_rms,this->preemphasis_);
    if (iVar3 == 0) {
      bVar14 = false;
    }
    else {
      if (-1 < (int)uVar8) {
        pfVar1 = (output->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar9 = 0;
        do {
          *(undefined4 *)((long)pvVar5 + uVar9 * 4) = 0;
          pfVar1[uVar9] = 0.0;
          uVar9 = uVar9 + 1;
        } while (uVar10 != uVar9);
      }
      uVar9 = (ulong)uVar10;
      if ((int)uVar8 < 0) {
        fVar16 = 0.0;
      }
      else {
        fVar16 = 0.0;
        uVar6 = 0;
        do {
          fVar16 = fVar16 + lpca_00[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar9 != uVar6);
      }
      if ((int)local_b0 < 1) {
        bVar14 = true;
      }
      else {
        fVar16 = (float)(~-(uint)(0.0 < fVar16) & 0x3f800000 | (uint)fVar16 & -(uint)(0.0 < fVar16))
        ;
        uStack_74 = 0;
        uStack_70 = 0;
        uStack_6c = 0;
        local_80 = (long)iVar7;
        local_98 = uVar11 + 1;
        lVar12 = 0;
        lVar15 = 0;
        iVar3 = wsize / 2 - uVar8;
        local_88 = output;
        do {
          local_90 = lVar12;
          local_78 = fVar16;
          iVar4 = LpcAnalyzer::ComputeLpc
                            (&lp,uVar8,this->noise_floor_,wsize,
                             (input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar12,lpca,(float *)0x0,
                             (float *)0x0,&norm_error,&preemp_rms,this->preemphasis_);
          bVar14 = iVar4 != 0;
          if (iVar4 == 0) break;
          if ((int)uVar8 < 0) {
            fVar17 = 0.0;
          }
          else {
            fVar17 = 0.0;
            uVar6 = 0;
            do {
              fVar17 = fVar17 + lpca[uVar6];
              uVar6 = uVar6 + 1;
            } while (uVar9 != uVar6);
          }
          if (uVar8 < 0x7fffffff) {
            uVar6 = 0;
            do {
              *(float *)((long)pvVar5 + uVar6 * 4) = (lpca[uVar6] - lpca_00[uVar6]) / (float)iVar3;
              uVar6 = uVar6 + 1;
            } while (uVar9 != uVar6);
          }
          fVar16 = local_78;
          if (0 < iVar3) {
            pfVar1 = (input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pfVar2 = (local_88->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            lVar15 = (long)(int)lVar15;
            uVar11 = (ulong)(int)uVar11;
            iVar4 = 0;
            do {
              lVar12 = lVar15;
              if ((int)uVar8 < 1) {
                fVar18 = 0.0;
              }
              else {
                fVar18 = 0.0;
                lVar13 = local_98;
                do {
                  fVar18 = fVar18 + pfVar1[lVar12] * lpca_00[lVar13 + -1];
                  lpca_00[lVar13 + -1] =
                       lpca_00[lVar13 + -1] + *(float *)((long)pvVar5 + lVar13 * 4 + -4);
                  lVar12 = lVar12 + 1;
                  lVar13 = lVar13 + -1;
                } while (1 < lVar13);
              }
              pfVar2[uVar11] = (fVar18 + pfVar1[(int)lVar12]) / fVar16;
              fVar16 = fVar16 + ((float)(~-(uint)(0.0 < fVar17) & 0x3f800000 |
                                        (uint)fVar17 & -(uint)(0.0 < fVar17)) - local_78) /
                                (float)iVar3;
              iVar4 = iVar4 + 1;
              lVar15 = lVar15 + 1;
              uVar11 = uVar11 + 1;
            } while (iVar4 != iVar3);
          }
          iVar4 = (int)local_b0;
          local_b0 = (ulong)(iVar4 - 1);
          lVar12 = local_90 + local_80;
          iVar3 = iVar7;
        } while (1 < iVar4);
      }
    }
    operator_delete__(lpca);
    operator_delete__(lpca_00);
    operator_delete__(pvVar5);
    LpcAnalyzer::~LpcAnalyzer(&lp);
  }
  return bVar14;
}

Assistant:

bool EpochTracker::GetLpcResidual(const std::vector<float>& input, float sample_rate,
                                  std::vector<float>* output) {
  int32_t n_input = input.size();
  if (!((n_input > 0) && (sample_rate > 0.0) && output)) {
    return false;
  }
  output->resize(n_input);
  int32_t frame_step = RoundUp(sample_rate * lpc_frame_interval_);
  int32_t frame_size = RoundUp(sample_rate * frame_duration_);
  int32_t n_frames = 1 + ((n_input - frame_size) / frame_step);
  int32_t n_analyzed = ((n_frames - 1) * frame_step) + frame_size;
  // Must have one more than frame size to do a complete frame.
  if (n_analyzed <= n_input) {
    n_frames--;
    if (n_frames <= 0) {
      return false;
    }
  }
  LpcAnalyzer lp;
  int32_t order = lp.GetLpcOrder(sample_rate);
  float* lpc = new float[order + 1];
  float* old_lpc = new float[order + 1];
  float* delta_lpc = new float[order + 1];
  float norm_error = 0.0;
  float preemp_rms = 0.0;

#define  RELEASE_MEMORY() {                     \
    delete [] lpc;                              \
    delete [] old_lpc;                          \
    delete [] delta_lpc;                        \
  }

  if (!lp.ComputeLpc(order, noise_floor_, frame_size, &(input.front()),
                     old_lpc, NULL, NULL, &norm_error, &preemp_rms,
                     preemphasis_)) {
    RELEASE_MEMORY();
    return false;
  }
  for (int32_t i = 0; i <= order; ++i) {
    delta_lpc[i] = 0.0;
    (*output)[i] = 0.0;
  }
  float old_gain = LpcDcGain(old_lpc, order);
  float new_gain = 1.0;
  int32_t n_to_filter = (frame_size / 2) - order;  // How many samples
  // to process before
  // computing the next
  // LPC frame.
  int32_t input_p = 0;  // Where to get the next frame for LPC analysis
  int32_t output_p = order;  // where to store output samples.
  int32_t proc_p = 0;  // Where to pick up samples for input to the filter

  // Main processing loop:
  // Compute a new frame of LPC
  // Compute the DC gain for the new LPC
  // Compute delta DC gain.
  // Compute the LPC deltas.
  // For each point in the frame:
  //   Use old_lpc to produce an output point.
  //   Update the old LPCs and the DC gain
  // As soon as the center of the current frame is reached, compute
  // the LPC for the next frame.
  for ( ; n_frames > 0; --n_frames, input_p += frame_step,
            n_to_filter = frame_step) {
    if (!lp.ComputeLpc(order, noise_floor_, frame_size,
                       (&(input.front())) + input_p, lpc, NULL, NULL,
                       &norm_error, &preemp_rms, preemphasis_)) {
      RELEASE_MEMORY();
      return false;
    }
    new_gain = LpcDcGain(lpc, order);
    float delta_gain = (new_gain - old_gain) / n_to_filter;
    MakeDeltas(old_lpc, lpc, order+1, n_to_filter, delta_lpc);
    for (int32_t sample = 0; sample < n_to_filter; ++sample, ++proc_p,
             ++output_p) {
      float sum = 0.0;
      int32_t mem = proc_p;
      for (int32_t k = order; k > 0; --k, ++mem) {
        sum += (old_lpc[k] * input[mem]);
        old_lpc[k] += delta_lpc[k];
      }
      sum += input[mem];  // lpc[0] is always 1.0
      (*output)[output_p] = sum / old_gain;
      old_gain += delta_gain;
    }
  }
  RELEASE_MEMORY();
  return true;
}